

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O3

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsinfCaseInstance::~IsinfCaseInstance(IsinfCaseInstance *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ShaderExecutor *pSVar2;
  pointer pcVar3;
  
  (this->super_CommonFunctionTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__CommonFunctionTestInstance_00d04600;
  pSVar2 = (this->super_CommonFunctionTestInstance).m_executor.
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  if (pSVar2 != (ShaderExecutor *)0x0) {
    (*pSVar2->_vptr_ShaderExecutor[1])();
    (this->super_CommonFunctionTestInstance).m_executor.
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data.ptr = (ShaderExecutor *)0x0;
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)&(this->super_CommonFunctionTestInstance).m_failMsg);
  std::ios_base::~ios_base((ios_base *)&(this->super_CommonFunctionTestInstance).field_0x108);
  pcVar3 = (this->super_CommonFunctionTestInstance).m_spec.source._M_dataplus._M_p;
  paVar1 = &(this->super_CommonFunctionTestInstance).m_spec.source.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_CommonFunctionTestInstance).m_spec.globalDeclarations._M_dataplus._M_p;
  paVar1 = &(this->super_CommonFunctionTestInstance).m_spec.globalDeclarations.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->super_CommonFunctionTestInstance).m_spec.outputs);
  std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::~vector
            (&(this->super_CommonFunctionTestInstance).m_spec.inputs);
  operator_delete(this,0x220);
  return;
}

Assistant:

IsinfCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: CommonFunctionTestInstance(context, shaderType, spec, numValues, name)
	{
	}